

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O0

void readliteral_cc(BinarySource *bs,termchar *c,termline *ldata,unsigned_long *state)

{
  termchar *ptVar1;
  unsigned_long uStack_50;
  wchar_t x;
  unsigned_long zstate;
  termchar n;
  unsigned_long *state_local;
  termline *ldata_local;
  termchar *c_local;
  BinarySource *bs_local;
  
  ptVar1 = ldata->chars;
  c->cc_next = L'\0';
  n._24_8_ = state;
  while( true ) {
    uStack_50 = 0;
    readliteral_chr(bs,(termchar *)&zstate,ldata,&stack0xffffffffffffffb0);
    if (zstate == 0) break;
    add_cc(ldata,(wchar_t)((long)c - (long)ptVar1 >> 5),zstate);
  }
  return;
}

Assistant:

static void readliteral_cc(BinarySource *bs, termchar *c, termline *ldata,
                           unsigned long *state)
{
    termchar n;
    unsigned long zstate;
    int x = c - ldata->chars;

    c->cc_next = 0;

    while (1) {
        zstate = 0;
        readliteral_chr(bs, &n, ldata, &zstate);
        if (!n.chr)
            break;
        add_cc(ldata, x, n.chr);
    }
}